

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrecHelper.cpp
# Opt level: O0

char typeCharacter(DataType type)

{
  DataType type_local;
  
  if (type != HELICS_STRING) {
    if (type == HELICS_DOUBLE) {
      return 'd';
    }
    if (type == HELICS_INT) {
      return 'i';
    }
    if (type == HELICS_COMPLEX) {
      return 'c';
    }
    if (type == HELICS_VECTOR) {
      return 'v';
    }
    if (type != HELICS_CHAR) {
      if ((type != HELICS_CUSTOM) && (type == HELICS_ANY)) {
        return 'a';
      }
      return 'u';
    }
  }
  return 's';
}

Assistant:

char typeCharacter(DataType type)
{
    switch (type) {
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
            return 's';
        case DataType::HELICS_DOUBLE:
            return 'd';
        case DataType::HELICS_INT:
            return 'i';
        case DataType::HELICS_COMPLEX:
            return 'c';
        case DataType::HELICS_VECTOR:
            return 'v';
        case DataType::HELICS_ANY:
            return 'a';
        case DataType::HELICS_CUSTOM:
        default:
            return 'u';
    }
}